

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_events_cpp.cpp
# Opt level: O3

int main(void)

{
  _Bool _Var1;
  uint uVar2;
  mfb_update_state mVar3;
  mfb_window *window;
  long lVar4;
  uint uVar5;
  Events e;
  undefined1 local_131;
  _Any_data local_130;
  code *local_120;
  code *local_118;
  _Any_data local_110;
  code *local_100;
  code *local_f8;
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  window = mfb_open_ex("Input Events CPP Test",800,600,1);
  if (window != (mfb_window *)0x0) {
    local_50._8_8_ = 0;
    local_50._M_unused._M_object = operator_new(0x18);
    *(code **)local_50._M_unused._0_8_ = Events::active;
    *(undefined8 *)((long)local_50._M_unused._0_8_ + 8) = 0;
    *(undefined1 **)((long)local_50._M_unused._0_8_ + 0x10) = &local_131;
    local_38 = std::
               _Function_handler<void_(mfb_window_*,_bool),_std::_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(mfb_window_*,_bool)>_>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(mfb_window_*,_bool),_std::_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(mfb_window_*,_bool)>_>
               ::_M_manager;
    mfb_set_active_callback((function<void_(mfb_window_*,_bool)> *)&local_50,window);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    local_70._8_8_ = 0;
    local_70._M_unused._M_object = operator_new(0x18);
    *(code **)local_70._M_unused._0_8_ = Events::resize;
    *(undefined8 *)((long)local_70._M_unused._0_8_ + 8) = 0;
    *(undefined1 **)((long)local_70._M_unused._0_8_ + 0x10) = &local_131;
    local_58 = std::
               _Function_handler<void_(mfb_window_*,_int,_int),_std::_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(mfb_window_*,_int,_int)>_>
               ::_M_invoke;
    local_60 = std::
               _Function_handler<void_(mfb_window_*,_int,_int),_std::_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(mfb_window_*,_int,_int)>_>
               ::_M_manager;
    mfb_set_resize_callback((function<void_(mfb_window_*,_int,_int)> *)&local_70,window);
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,__destroy_functor);
    }
    local_90._8_8_ = 0;
    local_90._M_unused._M_object = operator_new(0x18);
    *(code **)local_90._M_unused._0_8_ = Events::close;
    *(undefined8 *)((long)local_90._M_unused._0_8_ + 8) = 0;
    *(undefined1 **)((long)local_90._M_unused._0_8_ + 0x10) = &local_131;
    local_78 = std::
               _Function_handler<bool_(mfb_window_*),_std::_Bind<bool_(Events::*(Events_*,_std::_Placeholder<1>))(mfb_window_*)>_>
               ::_M_invoke;
    local_80 = std::
               _Function_handler<bool_(mfb_window_*),_std::_Bind<bool_(Events::*(Events_*,_std::_Placeholder<1>))(mfb_window_*)>_>
               ::_M_manager;
    mfb_set_close_callback((function<bool_(mfb_window_*)> *)&local_90,window);
    if (local_80 != (code *)0x0) {
      (*local_80)(&local_90,&local_90,__destroy_functor);
    }
    local_b0._8_8_ = 0;
    local_b0._M_unused._M_object = operator_new(0x18);
    *(code **)local_b0._M_unused._0_8_ = Events::keyboard;
    *(undefined8 *)((long)local_b0._M_unused._0_8_ + 8) = 0;
    *(undefined1 **)((long)local_b0._M_unused._0_8_ + 0x10) = &local_131;
    local_98 = std::
               _Function_handler<void_(mfb_window_*,_mfb_key,_mfb_key_mod,_bool),_std::_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(mfb_window_*,_mfb_key,_mfb_key_mod,_bool)>_>
               ::_M_invoke;
    local_a0 = std::
               _Function_handler<void_(mfb_window_*,_mfb_key,_mfb_key_mod,_bool),_std::_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(mfb_window_*,_mfb_key,_mfb_key_mod,_bool)>_>
               ::_M_manager;
    mfb_set_keyboard_callback
              ((function<void_(mfb_window_*,_mfb_key,_mfb_key_mod,_bool)> *)&local_b0,window);
    if (local_a0 != (code *)0x0) {
      (*local_a0)(&local_b0,&local_b0,__destroy_functor);
    }
    local_d0._8_8_ = 0;
    local_d0._M_unused._M_object = operator_new(0x18);
    *(code **)local_d0._M_unused._0_8_ = Events::char_input;
    *(undefined8 *)((long)local_d0._M_unused._0_8_ + 8) = 0;
    *(undefined1 **)((long)local_d0._M_unused._0_8_ + 0x10) = &local_131;
    local_b8 = std::
               _Function_handler<void_(mfb_window_*,_unsigned_int),_std::_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(mfb_window_*,_unsigned_int)>_>
               ::_M_invoke;
    local_c0 = std::
               _Function_handler<void_(mfb_window_*,_unsigned_int),_std::_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(mfb_window_*,_unsigned_int)>_>
               ::_M_manager;
    mfb_set_char_input_callback((function<void_(mfb_window_*,_unsigned_int)> *)&local_d0,window);
    if (local_c0 != (code *)0x0) {
      (*local_c0)(&local_d0,&local_d0,__destroy_functor);
    }
    local_f0._8_8_ = 0;
    local_f0._M_unused._M_object = operator_new(0x18);
    *(code **)local_f0._M_unused._0_8_ = Events::mouse_button;
    *(undefined8 *)((long)local_f0._M_unused._0_8_ + 8) = 0;
    *(undefined1 **)((long)local_f0._M_unused._0_8_ + 0x10) = &local_131;
    local_d8 = std::
               _Function_handler<void_(mfb_window_*,_mfb_mouse_button,_mfb_key_mod,_bool),_std::_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(mfb_window_*,_mfb_mouse_button,_mfb_key_mod,_bool)>_>
               ::_M_invoke;
    local_e0 = std::
               _Function_handler<void_(mfb_window_*,_mfb_mouse_button,_mfb_key_mod,_bool),_std::_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(mfb_window_*,_mfb_mouse_button,_mfb_key_mod,_bool)>_>
               ::_M_manager;
    mfb_set_mouse_button_callback
              ((function<void_(mfb_window_*,_mfb_mouse_button,_mfb_key_mod,_bool)> *)&local_f0,
               window);
    if (local_e0 != (code *)0x0) {
      (*local_e0)(&local_f0,&local_f0,__destroy_functor);
    }
    local_110._8_8_ = 0;
    local_110._M_unused._M_object = operator_new(0x18);
    *(code **)local_110._M_unused._0_8_ = Events::mouse_move;
    *(undefined8 *)((long)local_110._M_unused._0_8_ + 8) = 0;
    *(undefined1 **)((long)local_110._M_unused._0_8_ + 0x10) = &local_131;
    local_f8 = std::
               _Function_handler<void_(mfb_window_*,_int,_int),_std::_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(mfb_window_*,_int,_int)>_>
               ::_M_invoke;
    local_100 = std::
                _Function_handler<void_(mfb_window_*,_int,_int),_std::_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(mfb_window_*,_int,_int)>_>
                ::_M_manager;
    mfb_set_mouse_move_callback((function<void_(mfb_window_*,_int,_int)> *)&local_110,window);
    if (local_100 != (code *)0x0) {
      (*local_100)(&local_110,&local_110,__destroy_functor);
    }
    local_130._8_8_ = 0;
    local_130._M_unused._M_object = operator_new(0x18);
    *(code **)local_130._M_unused._0_8_ = Events::mouse_scroll;
    *(undefined8 *)((long)local_130._M_unused._0_8_ + 8) = 0;
    *(undefined1 **)((long)local_130._M_unused._0_8_ + 0x10) = &local_131;
    local_118 = std::
                _Function_handler<void_(mfb_window_*,_mfb_key_mod,_float,_float),_std::_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(mfb_window_*,_mfb_key_mod,_float,_float)>_>
                ::_M_invoke;
    local_120 = std::
                _Function_handler<void_(mfb_window_*,_mfb_key_mod,_float,_float),_std::_Bind<void_(Events::*(Events_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(mfb_window_*,_mfb_key_mod,_float,_float)>_>
                ::_M_manager;
    mfb_set_mouse_scroll_callback
              ((function<void_(mfb_window_*,_mfb_key_mod,_float,_float)> *)&local_130,window);
    if (local_120 != (code *)0x0) {
      (*local_120)(&local_130,&local_130,__destroy_functor);
    }
    mfb_set_user_data(window,"Input Events CPP Test");
    uVar5 = 0xbeef;
    lVar4 = 0;
    do {
      do {
        uVar2 = (int)uVar5 >> 3 ^ uVar5;
        uVar5 = (uVar2 & 1) << 0x1e | (int)uVar5 >> 1;
        g_buffer[lVar4] = (uVar2 >> 1 & 0xff) * 0x10101 | 0xff000000;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 480000);
      mVar3 = mfb_update(window,g_buffer);
      if (mVar3 != STATE_OK) {
        return 0;
      }
      _Var1 = mfb_wait_sync(window);
      lVar4 = 0;
    } while (_Var1);
  }
  return 0;
}

Assistant:

int
main()
{
    int noise, carry, seed = 0xbeef;

    struct mfb_window *window = mfb_open_ex("Input Events CPP Test", WIDTH, HEIGHT, WF_RESIZABLE);
    if (!window)
        return 0;

    Events e;

#if defined(kUseOldFunctions)

    mfb_set_active_callback(window, &e, &Events::active);
    mfb_set_resize_callback(window, &e, &Events::resize);
    mfb_set_close_callback(window, &e, &Events::close);
    mfb_set_keyboard_callback(window, &e, &Events::keyboard);
    mfb_set_char_input_callback(window, &e, &Events::char_input);
    mfb_set_mouse_button_callback(window, &e, &Events::mouse_button);
    mfb_set_mouse_move_callback(window, &e, &Events::mouse_move);
    mfb_set_mouse_scroll_callback(window, &e, &Events::mouse_scroll);

#elif defined(kUseLambdas)

    mfb_set_active_callback([](struct mfb_window *window, bool isActive) {
        const char *window_title = "";
        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }
        fprintf(stdout, "%s > active: %d (lambda)\n", window_title, isActive);
    }, window);

    mfb_set_resize_callback([](struct mfb_window *window, int width, int height) {
        uint32_t x = 0;
        uint32_t y = 0;
        const char *window_title = "";
        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }

        fprintf(stdout, "%s > resize: %d, %d\n", window_title, width, height);
        if(width > WIDTH) {
            x = (width - WIDTH) >> 1;
            width = WIDTH;
        }
        if(height > HEIGHT) {
            y = (height - HEIGHT) >> 1;
            height = HEIGHT;
        }
        mfb_set_viewport(window, x, y, width, height);
    }, window);

    mfb_set_close_callback([](struct mfb_window *window) {
        const char* window_title = "";
        if (window) {
            window_title = (const char*) mfb_get_user_data(window);
        }
        fprintf(stdout, "%s > close\n", window_title);
        return true;    // true => confirm close
                        // false => don't close
    }, window);

    mfb_set_keyboard_callback([](struct mfb_window *window, mfb_key key, mfb_key_mod mod, bool isPressed) {
        const char *window_title = "";
        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }
        fprintf(stdout, "%s > keyboard: key: %s (pressed: %d) [key_mod: %x]\n", window_title, mfb_get_key_name(key), isPressed, mod);
        if(key == KB_KEY_ESCAPE) {
            mfb_close(window);
        }
    }, window);

    mfb_set_char_input_callback([](struct mfb_window *window, unsigned int charCode) {
        const char *window_title = "";
        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }
        fprintf(stdout, "%s > charCode: %d\n", window_title, charCode);
    }, window);

    mfb_set_mouse_button_callback([](struct mfb_window *window, mfb_mouse_button button, mfb_key_mod mod, bool isPressed) {
        const char  *window_title = "";
        int         x, y;

        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }
        x = mfb_get_mouse_x(window);
        y = mfb_get_mouse_y(window);
        fprintf(stdout, "%s > mouse_button: button: %d (pressed: %d) (at: %d, %d) [key_mod: %x]\n", window_title, button, isPressed, x, y, mod);
    }, window);

    mfb_set_mouse_move_callback([](struct mfb_window *window, int x, int y) {
        kUnused(window);
        kUnused(x);
        kUnused(y);
        //const char *window_title = "";
        //if(window) {
        //    window_title = (const char *) mfb_get_user_data(window);
        //}
        //fprintf(stdout, "%s > mouse_move: %d, %d\n", window_title, x, y);
    }, window);

    mfb_set_mouse_scroll_callback([](struct mfb_window *window, mfb_key_mod mod, float deltaX, float deltaY) {
        const char *window_title = "";
        if(window) {
            window_title = (const char *) mfb_get_user_data(window);
        }
        fprintf(stdout, "%s > mouse_scroll: x: %f, y: %f [key_mod: %x]\n", window_title, deltaX, deltaY, mod);
    }, window);

#else

    using namespace std::placeholders;

    mfb_set_active_callback      (std::bind(&Events::active,       &e, _1, _2),         window);
    mfb_set_resize_callback      (std::bind(&Events::resize,       &e, _1, _2, _3),     window);
    mfb_set_close_callback       (std::bind(&Events::close,        &e, _1),             window);
    mfb_set_keyboard_callback    (std::bind(&Events::keyboard,     &e, _1, _2, _3, _4), window);
    mfb_set_char_input_callback  (std::bind(&Events::char_input,   &e, _1, _2),         window);
    mfb_set_mouse_button_callback(std::bind(&Events::mouse_button, &e, _1, _2, _3, _4), window);
    mfb_set_mouse_move_callback  (std::bind(&Events::mouse_move,   &e, _1, _2, _3),     window);
    mfb_set_mouse_scroll_callback(std::bind(&Events::mouse_scroll, &e, _1, _2, _3, _4), window);

#endif

    mfb_set_user_data(window, (void *) "Input Events CPP Test");

    do {
        int         i;
        mfb_update_state state;

        for (i = 0; i < WIDTH * HEIGHT; ++i) {
            noise = seed;
            noise >>= 3;
            noise ^= seed;
            carry = noise & 1;
            noise >>= 1;
            seed >>= 1;
            seed |= (carry << 30);
            noise &= 0xFF;
            g_buffer[i] = MFB_ARGB(0xff, noise, noise, noise);
        }

        state = mfb_update(window, g_buffer);
        if (state != STATE_OK) {
            window = 0x0;
            break;
        }
    } while(mfb_wait_sync(window));

    return 0;
}